

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O0

double __thiscall libDAI::IJGP::run(IJGP *this)

{
  ulong uVar1;
  IJGP *pIVar2;
  bool bVar3;
  value vVar4;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  IJGP *this_00;
  size_t sVar9;
  reference puVar10;
  clock_t cVar11;
  void *this_01;
  long *in_RDI;
  double dVar12;
  Factor nb;
  size_t i_1;
  R_nb_cit alpha_1;
  size_t beta;
  R_nb_cit alpha2;
  R_nb_cit beta2;
  size_t alpha;
  size_t t;
  size_t e;
  size_t i;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  Diffs diffs;
  clock_t tic;
  Diffs *in_stack_fffffffffffffb98;
  RegionGraph *in_stack_fffffffffffffba0;
  TFactor<double> *in_stack_fffffffffffffba8;
  IJGP *in_stack_fffffffffffffbb0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffbb8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffbc0;
  size_type in_stack_fffffffffffffbc8;
  Diffs *in_stack_fffffffffffffbd0;
  size_type in_stack_fffffffffffffbd8;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffbe0;
  TFactor<double> *in_stack_fffffffffffffbf8;
  TFactor<double> *in_stack_fffffffffffffc00;
  double in_stack_fffffffffffffc18;
  Diffs *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 uVar13;
  undefined1 local_1f0 [56];
  ulong local_1b8;
  unsigned_long *local_1b0;
  unsigned_long *local_1a8;
  unsigned_long *local_1a0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_198 [8];
  ulong local_158;
  unsigned_long *local_150;
  unsigned_long *local_148;
  unsigned_long *local_140;
  unsigned_long *local_138;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_130;
  unsigned_long *local_128;
  unsigned_long *local_120;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_118;
  ulong local_110;
  ulong local_108;
  unsigned_long *local_100;
  unsigned_long *local_f8;
  IJGP *local_f0;
  undefined1 local_e8 [56];
  ulong local_b0;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90 [3];
  clock_t local_40;
  string local_28 [40];
  
  if (in_RDI[0x40] != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Starting ");
    (**(code **)(*in_RDI + 0x48))();
    poVar5 = std::operator<<(poVar5,local_28);
    std::operator<<(poVar5,"...");
    std::__cxx11::string::~string(local_28);
  }
  if (2 < (ulong)in_RDI[0x40]) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  local_40 = toc();
  plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar6 + 0x28))();
  Diffs::Diffs(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
               (double)in_stack_fffffffffffffbc0._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xb581f7);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb58204)
  ;
  plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar6 + 0x28))();
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  local_b0 = 0;
  while( true ) {
    uVar1 = local_b0;
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar7 = (**(code **)(*plVar6 + 0x28))();
    if (uVar7 <= uVar1) break;
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar8 = (**(code **)(*plVar6 + 0x30))(plVar6,local_b0);
    (**(code **)(*in_RDI + 0x50))(local_e8,in_RDI,uVar8);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffba0,(value_type *)in_stack_fffffffffffffb98);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffba0);
    local_b0 = local_b0 + 1;
  }
  (**(code **)(*in_RDI + 0x28))();
  RegionGraph::nr_Redges((RegionGraph *)0xb583c1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8);
  local_f0 = (IJGP *)0x0;
  while( true ) {
    pIVar2 = local_f0;
    (**(code **)(*in_RDI + 0x28))();
    this_00 = (IJGP *)RegionGraph::nr_Redges((RegionGraph *)0xb58426);
    if (this_00 <= pIVar2) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbb0,
               (value_type_conflict2 *)in_stack_fffffffffffffba8);
    local_f0 = (IJGP *)((long)&(local_f0->super_DAIAlgRG).super_InferenceAlgorithm.
                               _vptr_InferenceAlgorithm + 1);
  }
  in_RDI[0x44] = 0;
  while( true ) {
    uVar13 = false;
    if ((ulong)in_RDI[0x44] < (ulong)in_RDI[0x3f]) {
      dVar12 = Diffs::max(in_stack_fffffffffffffb98);
      uVar13 = (double)in_RDI[0x3e] < dVar12;
    }
    if ((bool)uVar13 == false) break;
    vVar4 = UpdateType::operator_cast_to_value((UpdateType *)(in_RDI + 0x3d));
    if (vVar4 == SEQRND) {
      local_f8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffb98);
      local_100 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffb98);
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    }
    local_108 = 0;
    while( true ) {
      uVar1 = local_108;
      (**(code **)(*in_RDI + 0x28))();
      sVar9 = RegionGraph::nr_Redges((RegionGraph *)0xb585ae);
      if (sVar9 <= uVar1) break;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_90,local_108);
      updateMessage(this_00,CONCAT17(uVar13,in_stack_fffffffffffffd88));
      local_108 = local_108 + 1;
    }
    local_110 = 0;
    while( true ) {
      uVar1 = local_110;
      (**(code **)(*in_RDI + 0x28))();
      sVar9 = RegionGraph::nr_ORs((RegionGraph *)0xb58653);
      if (sVar9 <= uVar1) break;
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::OR(in_stack_fffffffffffffba0,(long)in_stack_fffffffffffffb98);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 (in_RDI + 0x45),local_110);
      TFactor<double>::operator=
                ((TFactor<double> *)in_stack_fffffffffffffba0,
                 (TFactor<double> *)in_stack_fffffffffffffb98);
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nbOR(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      local_120 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffb98);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffba0,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffb98);
      while( true ) {
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::nbOR(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        local_128 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffb98);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffba0,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffb98);
        if (!bVar3) break;
        (**(code **)(*in_RDI + 0x28))();
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(&local_118);
        RegionGraph::nbIR(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        local_138 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffb98);
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffffba0,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffffb98);
        while( true ) {
          (**(code **)(*in_RDI + 0x28))();
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(&local_118);
          RegionGraph::nbIR(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
          local_140 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffffb98);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffba0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffb98);
          if (!bVar3) break;
          puVar10 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_130);
          if (*puVar10 != local_110) {
            __gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*(&local_130);
            __gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*(&local_118);
            message(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                    (size_t)in_stack_fffffffffffffba0);
            std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
            operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *
                       )(in_RDI + 0x45),local_110);
            TFactor<double>::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          }
          local_148 = (unsigned_long *)
                      __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffffba8,
                                   (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
        }
        local_150 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffffba8,
                                 (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      }
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 (in_RDI + 0x45),local_110);
      TFactor<double>::normalize
                ((TFactor<double> *)in_stack_fffffffffffffba0,
                 (NormType)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      local_110 = local_110 + 1;
    }
    local_158 = 0;
    while( true ) {
      uVar1 = local_158;
      (**(code **)(*in_RDI + 0x28))();
      sVar9 = RegionGraph::nr_IRs((RegionGraph *)0xb589e4);
      if (sVar9 <= uVar1) break;
      TFactor<double>::TFactor((TFactor<double> *)in_stack_fffffffffffffbb0);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 (in_RDI + 0x48),local_158);
      TFactor<double>::operator=
                ((TFactor<double> *)in_stack_fffffffffffffba0,
                 (TFactor<double> *)in_stack_fffffffffffffb98);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffba0);
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nbIR(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      local_1a0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffb98);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffba0,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffb98);
      while( true ) {
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::nbIR(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        local_1a8 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffb98);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffba0,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffb98);
        if (!bVar3) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_198);
        message(in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                (size_t)in_stack_fffffffffffffba0);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   (in_RDI + 0x48),local_158);
        TFactor<double>::operator*=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        local_1b0 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffffba8,
                                 (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      }
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 (in_RDI + 0x48),local_158);
      TFactor<double>::normalize
                ((TFactor<double> *)in_stack_fffffffffffffba0,
                 (NormType)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      local_158 = local_158 + 1;
    }
    local_1b8 = 0;
    while( true ) {
      uVar1 = local_1b8;
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar7 = (**(code **)(*plVar6 + 0x28))();
      if (uVar7 <= uVar1) break;
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar8 = (**(code **)(*plVar6 + 0x30))(plVar6,local_1b8);
      (**(code **)(*in_RDI + 0x50))(local_1f0,in_RDI,uVar8);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (&local_a8,local_1b8);
      dist(in_stack_fffffffffffffba8,(TFactor<double> *)in_stack_fffffffffffffba0,
           (DistType)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      Diffs::push(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (&local_a8,local_1b8);
      TFactor<double>::operator=
                ((TFactor<double> *)in_stack_fffffffffffffba0,
                 (TFactor<double> *)in_stack_fffffffffffffb98);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffba0);
      local_1b8 = local_1b8 + 1;
    }
    if (2 < (ulong)in_RDI[0x40]) {
      poVar5 = std::operator<<((ostream *)&std::cout,Name);
      poVar5 = std::operator<<(poVar5,"::run:  maxdiff ");
      dVar12 = Diffs::max(in_stack_fffffffffffffb98);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar12);
      poVar5 = std::operator<<(poVar5," after ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI[0x44] + 1);
      poVar5 = std::operator<<(poVar5," passes");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    in_RDI[0x44] = in_RDI[0x44] + 1;
  }
  dVar12 = Diffs::max(in_stack_fffffffffffffb98);
  if ((double)in_RDI[0x43] < dVar12) {
    dVar12 = Diffs::max(in_stack_fffffffffffffb98);
    in_RDI[0x43] = (long)dVar12;
  }
  if (in_RDI[0x40] != 0) {
    dVar12 = Diffs::max(in_stack_fffffffffffffb98);
    if (dVar12 <= (double)in_RDI[0x3e]) {
      if (2 < (ulong)in_RDI[0x40]) {
        poVar5 = std::operator<<((ostream *)&std::cout,Name);
        poVar5 = std::operator<<(poVar5,"::run:  converged in ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI[0x44]);
        poVar5 = std::operator<<(poVar5," passes (");
        in_stack_fffffffffffffbb0 = (IJGP *)toc();
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,(long)in_stack_fffffffffffffbb0 - local_40);
        poVar5 = std::operator<<(poVar5," clocks).");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      if (in_RDI[0x40] == 1) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,Name);
      poVar5 = std::operator<<(poVar5,"::run:  WARNING: not converged within ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI[0x3f]);
      poVar5 = std::operator<<(poVar5," passes (");
      cVar11 = toc();
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,cVar11 - local_40);
      poVar5 = std::operator<<(poVar5," clocks)...final maxdiff:");
      dVar12 = Diffs::max(in_stack_fffffffffffffb98);
      this_01 = (void *)std::ostream::operator<<(poVar5,dVar12);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
  }
  dVar12 = Diffs::max(in_stack_fffffffffffffb98);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffbb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbb0);
  Diffs::~Diffs((Diffs *)0xb591ae);
  return dVar12;
}

Assistant:

double IJGP::run() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << "...";
        if( Props.verbose >= 3)
           cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        vector<size_t> edge_seq;
//      vector<double> residuals;

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back( belief( grm().var(i) ) );

/*      if( Props.updates == UpdateType::SEQMAX ) {
            // do the first pass
            for(size_t iI = 0; iI < grm().nrEdges(); iI++ )
                calcNewMessage(iI);

            // calculate initial residuals
            residuals.reserve(grm().nrEdges());
            for( size_t iI = 0; iI < grm().nrEdges(); iI++ )
                residuals.push_back( dist( _newmessages[iI], _messages[iI], Prob::DISTLINF ) );
        } else {*/
            edge_seq.reserve( grm().nr_Redges() );
            for( size_t e = 0; e < grm().nr_Redges(); e++ )
                edge_seq.push_back( e );
//        }

        // IJGP with parent->child message updates
        // Do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
/*          if( Props.updates == UpdateType::SEQMAX ) {
                // Residuals-BP by Koller et al.
                for( size_t t = 0; t < grm().nrEdges(); t++ ) {
                    // update the message with the largest residual
                    size_t iI = max_element(residuals.begin(), residuals.end()) - residuals.begin();
                    updateMessage( iI );
                    residuals[iI] = 0;

                    // I->i has been updated, which means that residuals for all
                    // J->j with J in nb[i]\I and j in nb[J]\i have to be updated
                    size_t i = grm().edge(iI).first;
                    size_t I = grm().edge(iI).second;
                    for( FactorGraph::nb_cit J = grm().nbV(i).begin(); J != grm().nbV(i).end(); J++ )
                        if( *J != I )
                            for( FactorGraph::nb_cit j = grm().nbF(*J).begin(); j != grm().nbF(*J).end(); j++ )
                                if( *j != i ) {
                                    size_t jJ = grm().edge(*j,*J);
                                    calcNewMessage(jJ);
                                    residuals[jJ] = dist( _newmessages[jJ], _messages[jJ], Prob::DISTLINF );
                                }
                }
            } else if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    updateMessage(t);
            } else {*/
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );

                for( size_t t = 0; t < grm().nr_Redges(); t++ )
                    updateMessage( edge_seq[t] );
//            }

            // Calc outer region beliefs
            for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
                _Qa[alpha] = grm().OR(alpha);
                for( RegionGraph::R_nb_cit beta2 = grm().nbOR(alpha).begin(); beta2 != grm().nbOR(alpha).end(); beta2++ )
                    for( RegionGraph::R_nb_cit alpha2 = grm().nbIR(*beta2).begin(); alpha2 != grm().nbIR(*beta2).end(); alpha2++ )
                        if( *alpha2 != alpha )
                            _Qa[alpha] *= message(*alpha2, *beta2);
                _Qa[alpha].normalize();
            }

            // Calc inner region beliefs
            for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) {
                _Qb[beta] = Factor();
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ )
                    _Qb[beta] *= message(*alpha, beta);
                _Qb[beta].normalize();
            }

            // Calculate new variable beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( belief( grm().var(i) ) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }

            if( Props.verbose >= 3 )
                cout << Name << "::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Props.verbose >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Props.verbose == 1 )
                    cout << endl;
                    cout << Name << "::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Props.verbose >= 3 )
                    cout << Name << "::run:  converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }